

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O2

void Ivy_ManHaigTrasfer(Ivy_Man_t *p,Ivy_Man_t *pNew)

{
  void *pvVar1;
  void *pvVar2;
  int i;
  
  if (p->pHaig != (Ivy_Man_t *)0x0) {
    pNew->pConst1->pEquiv = p->pConst1->pEquiv;
    for (i = 0; i < pNew->vPis->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(pNew->vPis,i);
      pvVar2 = Vec_PtrEntry(p->vPis,i);
      *(undefined8 *)((long)pvVar1 + 0x48) = *(undefined8 *)((long)pvVar2 + 0x48);
    }
    pNew->pHaig = p->pHaig;
    return;
  }
  __assert_fail("p->pHaig != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                ,0x8d,"void Ivy_ManHaigTrasfer(Ivy_Man_t *, Ivy_Man_t *)");
}

Assistant:

void Ivy_ManHaigTrasfer( Ivy_Man_t * p, Ivy_Man_t * pNew )
{
    Ivy_Obj_t * pObj;
    int i;
    assert( p->pHaig != NULL );
    Ivy_ManConst1(pNew)->pEquiv = Ivy_ManConst1(p)->pEquiv;
    Ivy_ManForEachPi( pNew, pObj, i )
        pObj->pEquiv = Ivy_ManPi( p, i )->pEquiv;
    pNew->pHaig = p->pHaig;
}